

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_string___GetSubstitution(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValueUnion p;
  uint32_t uVar1;
  JSContext *ctx_00;
  int iVar2;
  uint to;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint from;
  ulong uVar11;
  JSValueUnion JVar12;
  uint uVar13;
  JSValue this_obj;
  JSValue JVar14;
  JSValue JVar15;
  JSValue obj;
  uint32_t captures_len;
  uint32_t position;
  uint32_t matched_len;
  uint32_t local_ac;
  StringBuffer local_a8;
  JSValueUnion local_88;
  uint32_t local_7c;
  uint32_t local_78;
  uint32_t local_74;
  int64_t local_70;
  JSContext *local_68;
  JSValueUnion local_60;
  JSValueUnion local_58;
  ulong local_50;
  JSValueUnion local_48;
  JSValueUnion local_40;
  JSValueUnion local_38;
  int64_t iVar10;
  
  JVar12 = this_val.u;
  JVar14 = *JVar12.ptr;
  JVar15 = *JVar12.ptr;
  local_60 = ((JSValue *)((long)JVar12.ptr + 0x10))->u;
  local_58 = (JSValueUnion)((JSValueUnion *)((long)JVar12.ptr + 0x30))->ptr;
  iVar10 = *(int64_t *)((long)JVar12.ptr + 0x38);
  local_48 = *(JSValueUnion *)((long)JVar12.ptr + 0x40);
  uVar9 = *(int64_t *)((long)JVar12.ptr + 0x48);
  p = *(JSValueUnion *)&(((JSValue *)((long)JVar12.ptr + 0x50))->u).int32;
  local_40 = p;
  local_38 = local_60;
  if ((*(int *)((long)JVar12.ptr + 0x58) == -7) && (*(int *)((long)JVar12.ptr + 0x18) == -7)) {
    local_a8.len = 0;
    local_a8.size = 0;
    local_a8.is_wide_char = 0;
    local_a8.error_status = 0;
    local_a8.ctx = ctx;
    local_a8.str = js_alloc_string(ctx,0,0);
    if (local_a8.str == (JSString *)0x0) {
      local_a8._16_8_ = local_a8._16_8_ & 0xffffffff;
      local_a8.error_status = -1;
    }
    local_ac = 0;
    if ((((int)iVar10 == 3) ||
        (obj.tag = iVar10, obj.u.float64 = local_58.float64,
        iVar2 = js_get_length32(ctx,&local_ac,obj), iVar2 == 0)) &&
       (iVar2 = js_get_length32(ctx,&local_74,JVar15), iVar2 == 0)) {
      local_88 = ((JSValue *)((long)JVar12.ptr + 0x20))->u;
      JVar15 = *(JSValue *)((long)JVar12.ptr + 0x20);
      if (0xfffffff4 < (uint)*(int64_t *)((long)JVar12.ptr + 0x28)) {
        *(int *)local_88.ptr = *local_88.ptr + 1;
      }
      iVar2 = JS_ToInt32Free(ctx,&local_88.int32,JVar15);
      if (-1 < iVar2) {
        uVar5 = *(uint *)((long)p.ptr + 4) & 0x7fffffff;
        uVar6 = 0;
        to = string_indexof_char((JSString *)p.ptr,0x24,0);
        uVar1 = local_ac;
        if (-1 < (int)to) {
          local_78 = local_88.int32;
          local_7c = local_74 + local_88.int32;
          local_50 = uVar9 & 0xffffffff;
          uVar11 = 0;
          local_70 = iVar10;
          local_68 = ctx;
          do {
            uVar6 = (uint32_t)uVar11;
            uVar8 = (ulong)to;
            if (uVar5 <= (uint)(uVar8 + 1)) break;
            string_buffer_concat(&local_a8,(JSString *)p.ptr,uVar6,to);
            iVar2 = (int)*(undefined8 *)((long)p.ptr + 4);
            if (iVar2 < 0) {
              uVar13 = (uint)*(ushort *)
                              ((long)&(((JSString *)((long)p.ptr + 0x10))->header).ref_count +
                              uVar8 * 2 + 2);
            }
            else {
              uVar13 = (uint)*(byte *)((long)&(((JSString *)((long)p.ptr + 0x10))->header).ref_count
                                      + uVar8 + 1);
            }
            uVar11 = uVar8 + 2;
            if (uVar13 < 0x27) {
              if (uVar13 == 0x24) {
                string_buffer_putc8(&local_a8,0x24);
              }
              else if (uVar13 == 0x26) {
                iVar2 = string_buffer_concat_value(&local_a8,JVar14);
LAB_00144094:
                if (iVar2 != 0) goto LAB_00143f68;
              }
              else {
LAB_001440c8:
                uVar4 = uVar13 - 0x30;
                from = (uint)uVar11;
                if (uVar4 < 10) {
                  if (from < uVar5) {
                    if (iVar2 < 0) {
                      uVar13 = (uint)*(ushort *)
                                      (&((JSString *)((long)p.ptr + 0x10))->field_0x4 + uVar8 * 2);
                    }
                    else {
                      uVar13 = (uint)*(byte *)((long)&(((JSString *)((long)p.ptr + 0x10))->header).
                                                      ref_count + uVar11);
                    }
                    if (uVar13 - 0x30 < 10) {
                      iVar2 = uVar13 + uVar4 * 10;
                      uVar13 = iVar2 - 0x30;
                      if (iVar2 >= 0x31 && uVar1 > uVar13) {
                        uVar4 = uVar13;
                      }
                      uVar7 = to + 3;
                      if (iVar2 < 0x31 || uVar1 <= uVar13) {
                        uVar7 = from;
                      }
                      uVar11 = (ulong)uVar7;
                    }
                  }
                  if (uVar1 <= uVar4 || (int)uVar4 < 1) {
LAB_00144237:
                    JVar12 = p;
                    uVar6 = (uint32_t)uVar11;
                    goto LAB_00144243;
                  }
                  JVar15.tag = local_70;
                  JVar15.u.float64 = local_58.float64;
                  JVar15 = JS_GetPropertyInt64(local_68,JVar15,(ulong)uVar4);
                  if ((int)JVar15.tag != 3) {
                    if ((int)JVar15.tag != 6) {
                      iVar2 = string_buffer_concat_value_free(&local_a8,JVar15);
                      goto LAB_00144094;
                    }
                    goto LAB_00143f68;
                  }
                }
                else {
                  if ((uVar13 != 0x3c || local_50 == 3) ||
                     (iVar2 = string_indexof_char((JSString *)p.ptr,0x3e,from), ctx_00 = local_68,
                     iVar2 < 0)) goto LAB_00144237;
                  JVar15 = js_sub_string(local_68,(JSString *)p.ptr,from,iVar2);
                  if ((int)JVar15.tag == 6) goto LAB_00143f68;
                  this_obj.tag = uVar9;
                  this_obj.u.float64 = local_48.float64;
                  JVar15 = JS_GetPropertyValue(ctx_00,this_obj,JVar15);
                  if (((int)JVar15.tag != 3) &&
                     (((int)JVar15.tag == 6 ||
                      (iVar3 = string_buffer_concat_value_free(&local_a8,JVar15), iVar3 != 0))))
                  goto LAB_00143f68;
                  uVar11 = (ulong)(iVar2 + 1);
                }
              }
            }
            else {
              JVar12 = local_60;
              if (uVar13 == 0x27) {
                uVar6 = *(uint *)((long)local_60.ptr + 4) & 0x7fffffff;
                to = local_7c;
              }
              else {
                if (uVar13 != 0x60) goto LAB_001440c8;
                uVar6 = local_78;
                to = 0;
              }
LAB_00144243:
              string_buffer_concat(&local_a8,(JSString *)JVar12.ptr,to,uVar6);
            }
            uVar6 = (uint32_t)uVar11;
            to = string_indexof_char((JSString *)p.ptr,0x24,uVar6);
          } while (-1 < (int)to);
        }
        string_buffer_concat
                  (&local_a8,(JSString *)p.ptr,uVar6,*(uint *)((long)p.ptr + 4) & 0x7fffffff);
        JVar15 = string_buffer_end(&local_a8);
        iVar10 = JVar15.tag;
        uVar9 = (ulong)JVar15.u.ptr & 0xffffffff00000000;
        uVar11 = (ulong)JVar15.u._0_4_;
        goto LAB_00143ec4;
      }
    }
LAB_00143f68:
    (*((local_a8.ctx)->rt->mf).js_free)(&(local_a8.ctx)->rt->malloc_state,local_a8.str);
  }
  else {
    JS_ThrowTypeError(ctx,"not a string");
  }
  uVar11 = 0;
  iVar10 = 6;
  uVar9 = 0;
LAB_00143ec4:
  JVar14.tag = iVar10;
  JVar14.u.ptr = (void *)(uVar11 | uVar9);
  return JVar14;
}

Assistant:

static JSValue js_string___GetSubstitution(JSContext *ctx, JSValueConst this_val,
                                           int argc, JSValueConst *argv)
{
    // GetSubstitution(matched, str, position, captures, namedCaptures, rep)
    JSValueConst matched, str, captures, namedCaptures, rep;
    JSValue capture, name, s;
    uint32_t position, len, matched_len, captures_len;
    int i, j, j0, k, k1;
    int c, c1;
    StringBuffer b_s, *b = &b_s;
    JSString *sp, *rp;

    matched = argv[0];
    str = argv[1];
    captures = argv[3];
    namedCaptures = argv[4];
    rep = argv[5];

    if (!JS_IsString(rep) || !JS_IsString(str))
        return JS_ThrowTypeError(ctx, "not a string");

    sp = JS_VALUE_GET_STRING(str);
    rp = JS_VALUE_GET_STRING(rep);

    string_buffer_init(ctx, b, 0);

    captures_len = 0;
    if (!JS_IsUndefined(captures)) {
        if (js_get_length32(ctx, &captures_len, captures))
            goto exception;
    }
    if (js_get_length32(ctx, &matched_len, matched))
        goto exception;
    if (JS_ToUint32(ctx, &position, argv[2]) < 0)
        goto exception;

    len = rp->len;
    i = 0;
    for(;;) {
        j = string_indexof_char(rp, '$', i);
        if (j < 0 || j + 1 >= len)
            break;
        string_buffer_concat(b, rp, i, j);
        j0 = j++;
        c = string_get(rp, j++);
        if (c == '$') {
            string_buffer_putc8(b, '$');
        } else if (c == '&') {
            if (string_buffer_concat_value(b, matched))
                goto exception;
        } else if (c == '`') {
            string_buffer_concat(b, sp, 0, position);
        } else if (c == '\'') {
            string_buffer_concat(b, sp, position + matched_len, sp->len);
        } else if (c >= '0' && c <= '9') {
            k = c - '0';
            if (j < len) {
                c1 = string_get(rp, j);
                if (c1 >= '0' && c1 <= '9') {
                    /* This behavior is specified in ES6 and refined in ECMA 2019 */
                    /* ECMA 2019 does not have the extra test, but
                       Test262 S15.5.4.11_A3_T1..3 require this behavior */
                    k1 = k * 10 + c1 - '0';
                    if (k1 >= 1 && k1 < captures_len) {
                        k = k1;
                        j++;
                    }
                }
            }
            if (k >= 1 && k < captures_len) {
                s = JS_GetPropertyInt64(ctx, captures, k);
                if (JS_IsException(s))
                    goto exception;
                if (!JS_IsUndefined(s)) {
                    if (string_buffer_concat_value_free(b, s))
                        goto exception;
                }
            } else {
                goto norep;
            }
        } else if (c == '<' && !JS_IsUndefined(namedCaptures)) {
            k = string_indexof_char(rp, '>', j);
            if (k < 0)
                goto norep;
            name = js_sub_string(ctx, rp, j, k);
            if (JS_IsException(name))
                goto exception;
            capture = JS_GetPropertyValue(ctx, namedCaptures, name);
            if (JS_IsException(capture))
                goto exception;
            if (!JS_IsUndefined(capture)) {
                if (string_buffer_concat_value_free(b, capture))
                    goto exception;
            }
            j = k + 1;
        } else {
        norep:
            string_buffer_concat(b, rp, j0, j);
        }
        i = j;
    }
    string_buffer_concat(b, rp, i, rp->len);
    return string_buffer_end(b);
exception:
    string_buffer_free(b);
    return JS_EXCEPTION;
}